

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgscon.c
# Opt level: O2

void cgscon(char *norm,SuperMatrix *L,SuperMatrix *U,float anorm,float *rcond,SuperLUStat_t *stat,
           int *info)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *diag;
  int iVar5;
  char *trans;
  char *uplo;
  int kase;
  singlecomplex *local_150;
  float ainvnm;
  float local_140;
  int nrow;
  int isave [3];
  
  *info = 0;
  cVar1 = *norm;
  isave[0] = 1;
  iVar3 = 2;
  iVar5 = isave[0];
  if (((cVar1 == '1') || (cVar1 == 'O')) || (iVar5 = iVar3, cVar1 == 'I')) {
    uVar2 = L->nrow;
    iVar4 = -2;
    isave[0] = iVar3;
    if (((-1 < (int)uVar2) && (uVar2 == L->ncol)) &&
       ((L->Stype == SLU_SC && ((L->Dtype == SLU_C && (L->Mtype == SLU_TRLU)))))) {
      iVar3 = U->nrow;
      isave[0] = 3;
      iVar4 = -3;
      if ((-1 < iVar3) &&
         ((((iVar3 == U->ncol && (U->Stype == SLU_NC)) && (U->Dtype == SLU_C)) &&
          (U->Mtype == SLU_TRU)))) {
        *rcond = 0.0;
        if ((ulong)uVar2 == 0 || iVar3 == 0) {
          *rcond = 1.0;
          return;
        }
        local_140 = anorm;
        local_150 = singlecomplexCalloc((ulong)uVar2 * 3);
        if (local_150 == (singlecomplex *)0x0) {
          sprintf((char *)isave,"%s at line %d in file %s\n",
                  "Malloc fails for work arrays in cgscon.",0x7f,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgscon.c"
                 );
          superlu_abort_and_exit((char *)isave);
        }
        ainvnm = 0.0;
        kase = 0;
        nrow = L->nrow;
        do {
          clacon2_(&nrow,local_150 + L->nrow,local_150,&ainvnm,&kase,isave);
          if (kase == 0) break;
          if (kase == iVar5) {
            sp_ctrsv("L","No trans","Unit",L,U,local_150,stat,info);
            uplo = "U";
            trans = "No trans";
            diag = "Non-unit";
          }
          else {
            sp_ctrsv("U","Transpose","Non-unit",L,U,local_150,stat,info);
            uplo = "L";
            trans = "Transpose";
            diag = "Unit";
          }
          sp_ctrsv(uplo,trans,diag,L,U,local_150,stat,info);
        } while (kase != 0);
        if ((ainvnm != 0.0) || (NAN(ainvnm))) {
          *rcond = (1.0 / ainvnm) / local_140;
        }
        superlu_free(local_150);
        return;
      }
    }
  }
  else {
    iVar4 = -1;
  }
  *info = iVar4;
  input_error("cgscon",isave);
  return;
}

Assistant:

void
cgscon(char *norm, SuperMatrix *L, SuperMatrix *U,
       float anorm, float *rcond, SuperLUStat_t *stat, int *info)
{


    /* Local variables */
    int    kase, kase1, onenrm;
    float ainvnm;
    singlecomplex *work;
    int    isave[3];
    extern int crscl_(int *, singlecomplex *, singlecomplex *, int *);

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    
    /* Test the input parameters. */
    *info = 0;
    onenrm = *(unsigned char *)norm == '1' || strncmp(norm, "O", 1)==0;
    if (! onenrm && strncmp(norm, "I", 1)!=0) *info = -1;
    else if (L->nrow < 0 || L->nrow != L->ncol ||
             L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU)
	 *info = -2;
    else if (U->nrow < 0 || U->nrow != U->ncol ||
             U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU) 
	*info = -3;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgscon", &ii);
	return;
    }

    /* Quick return if possible */
    *rcond = 0.;
    if ( L->nrow == 0 || U->nrow == 0) {
	*rcond = 1.;
	return;
    }

    work = singlecomplexCalloc( 3*L->nrow );


    if ( !work )
	ABORT("Malloc fails for work arrays in cgscon.");
    
    /* Estimate the norm of inv(A). */
    ainvnm = 0.;
    if ( onenrm ) kase1 = 1;
    else kase1 = 2;
    kase = 0;

    int nrow = L->nrow;

    do {
	clacon2_(&nrow, &work[L->nrow], &work[0], &ainvnm, &kase, isave);

	if (kase == 0) break;

	if (kase == kase1) {
	    /* Multiply by inv(L). */
	    sp_ctrsv("L", "No trans", "Unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(U). */
	    sp_ctrsv("U", "No trans", "Non-unit", L, U, &work[0], stat, info);
	    
	} else {

	    /* Multiply by inv(U'). */
	    sp_ctrsv("U", "Transpose", "Non-unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(L'). */
	    sp_ctrsv("L", "Transpose", "Unit", L, U, &work[0], stat, info);
	    
	}

    } while ( kase != 0 );

    /* Compute the estimate of the reciprocal condition number. */
    if (ainvnm != 0.) *rcond = (1. / ainvnm) / anorm;

    SUPERLU_FREE (work);
    return;

}